

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  undefined4 *puVar6;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *pPVar7;
  PreReservedVirtualAllocWrapper *this_00;
  uint base;
  uint pageCount_local;
  void *address_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  if (address < (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x229,"(address >= this->address)","address >= this->address");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pPVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  if (pPVar7->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22a,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pcVar1 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address;
  pPVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  if ((pPVar7->maxAllocPageCount - pageCount) * 0x1000 < (uint)((int)address - (int)pcVar1)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22c,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = IsFreeOrDecommitted(this,address,pageCount);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22e,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar4 = GetBitRangeBase(this,address);
  SetRangeInDecommitPagesBitVector(this,uVar4,pageCount);
  this->decommitPageCount = pageCount + this->decommitPageCount;
  pPVar7 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAllocator
                     (&this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
  this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ::GetVirtualAllocator(pPVar7);
  PreReservedVirtualAllocWrapper::Free(this_00,address,(ulong)(pageCount << 0xc),0x4000);
  uVar4 = this->decommitPageCount;
  uVar5 = GetCountOfDecommitPages(this);
  if (uVar4 != uVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x23b,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitPages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address))
      <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize);

    Assert(!IsFreeOrDecommitted(address, pageCount));
    uint base = this->GetBitRangeBase(address);

    this->SetRangeInDecommitPagesBitVector(base, pageCount);
    this->decommitPageCount += pageCount;

    if (!onlyUpdateState)
    {
#pragma warning(suppress: 6250)
        this->GetAllocator()->GetVirtualAllocator()->Free(address,
          pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    }

    Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());
}